

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::SetSpecificTrack(cmCTest *this,char *track)

{
  if (track != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->SpecificTrack);
    return;
  }
  (this->SpecificTrack)._M_string_length = 0;
  *(this->SpecificTrack)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCTest::SetSpecificTrack(const char* track)
{
  if (!track) {
    this->SpecificTrack.clear();
    return;
  }
  this->SpecificTrack = track;
}